

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  stringpiece_ssize_type sVar1;
  byte *pbVar2;
  long lVar3;
  char *pcVar4;
  iterator iVar5;
  ostream *poVar6;
  mapped_type *this_01;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  long lVar10;
  char *pcVar11;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *n;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  size_type pos;
  bool bVar17;
  StringPiece SVar18;
  StringPiece proto_file;
  StringPiece proto_file_list;
  key_type local_d0;
  key_type local_b0;
  byte *local_90;
  byte *local_88;
  StringPiece local_80;
  char local_70;
  undefined7 uStack_6f;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  ProtoFrameworkCollector *local_58;
  StringPiece local_50;
  ulong local_40 [2];
  
  local_50.length_ = (stringpiece_ssize_type)local_50.ptr_;
  sVar1 = StringPiece::find(line,':',0);
  n = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)(long)(int)sVar1;
  if (n == (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0xffffffffffffffff) {
    local_50.ptr_ = (char *)local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Framework/proto file mapping line without colon sign: \'","");
    pcVar4 = line->ptr_;
    if (pcVar4 == (char *)0x0) {
      local_80.ptr_ = &local_70;
      local_80.length_ = 0;
      local_70 = '\0';
    }
    else {
      local_80.ptr_ = &local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,pcVar4,pcVar4 + line->length_);
    }
    uVar14 = 0xf;
    if ((ulong *)local_50.ptr_ != local_40) {
      uVar14 = local_40[0];
    }
    if (uVar14 < (ulong)(local_80.length_ + local_50.length_)) {
      uVar14 = 0xf;
      if (local_80.ptr_ != &local_70) {
        uVar14 = CONCAT71(uStack_6f,local_70);
      }
      if (uVar14 < (ulong)(local_80.length_ + local_50.length_)) goto LAB_00268f0e;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_50.ptr_);
    }
    else {
LAB_00268f0e:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_80.ptr_)
      ;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0.field_2._8_8_ = puVar7[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_b0._M_string_length = puVar7[1];
    *puVar7 = psVar9;
    puVar7[1] = 0;
    *(undefined1 *)psVar9 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0.field_2._8_8_ = plVar8[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)out_error,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (local_80.ptr_ != &local_70) {
      operator_delete(local_80.ptr_);
    }
    if ((ulong *)local_50.ptr_ != local_40) {
      operator_delete(local_50.ptr_);
    }
    goto LAB_0026901d;
  }
  local_58 = this;
  SVar18 = StringPiece::substr(line,0,(size_type)n);
  lVar10 = SVar18.length_;
  pbVar2 = (byte *)SVar18.ptr_;
  local_50 = StringPiece::substr(line,(sVar1 << 0x20) + 0x100000000 >> 0x20,0xffffffffffffffff);
  local_88 = pbVar2;
  if (lVar10 == 0) {
    local_90 = (byte *)0x0;
  }
  else {
    lVar3 = -lVar10;
    do {
      if ((4 < *local_88 - 9) && (*local_88 != 0x20)) {
        lVar12 = 0;
        goto LAB_00268989;
      }
      local_88 = local_88 + 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    local_90 = (byte *)0x0;
    local_88 = pbVar2 + lVar10;
  }
  goto LAB_00268a38;
  while( true ) {
    local_80.length_ = lVar3;
    pcVar11 = pcVar11 + -1;
    bVar17 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    if (bVar17) break;
LAB_00268af3:
    if ((4 < (byte)pcVar11[-1] - 9) && (pcVar11[-1] != 0x20)) {
      local_60 = &local_58->map_->_M_t;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar4 + lVar12);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_60,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      local_60 = n;
      if ((_Rb_tree_header *)iVar5._M_node != &(local_58->map_->_M_t)._M_impl.super__Rb_tree_header)
      {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "warning: duplicate proto file reference, replacing framework entry for \'",0x48)
        ;
        if (local_80.ptr_ == (char *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_allocated_capacity =
               local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,local_80.ptr_,local_80.ptr_ + local_80.length_);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                            local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' with \'",8);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        if (local_88 == (byte *)0x0) {
          local_b0._M_string_length = 0;
          local_b0.field_2._M_allocated_capacity =
               local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,local_88,local_90);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' (was \'",8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,*(char **)(iVar5._M_node + 2),(long)iVar5._M_node[2]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\').",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        std::ostream::flush();
      }
      sVar1 = StringPiece::find(&local_80,' ',0);
      n = local_60;
      if (sVar1 != -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                   ,0x66);
        if (local_80.ptr_ == (char *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_allocated_capacity =
               local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,local_80.ptr_,local_80.ptr_ + local_80.length_);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_d0._M_dataplus._M_p,
                            local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        std::ostream::flush();
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      if (local_88 == (byte *)0x0) {
        local_d0._M_string_length = 0;
        local_d0.field_2._M_allocated_capacity =
             local_d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,local_88,local_90);
      }
      this_00 = local_58->map_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      if (local_80.ptr_ == (char *)0x0) {
        local_b0._M_string_length = 0;
        local_b0.field_2._M_allocated_capacity =
             local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,local_80.ptr_,local_80.ptr_ + local_80.length_);
      }
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_00,&local_b0);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      break;
    }
  }
LAB_00268e98:
  iVar16 = iVar15 + 1;
  pos = (size_type)iVar16;
  if (local_50.length_ <= (long)pos) goto LAB_0026901d;
  goto LAB_00268a59;
  while (bVar17 = lVar3 + 1 != lVar12, lVar12 = lVar12 + -1, bVar17) {
LAB_00268989:
    if ((4 < pbVar2[lVar12 + lVar10 + -1] - 9) && (pbVar2[lVar12 + lVar10 + -1] != 0x20)) {
      local_90 = (byte *)(lVar12 - lVar3);
      goto LAB_00268a38;
    }
  }
  local_90 = (byte *)0x0;
LAB_00268a38:
  if (0 < local_50.length_) {
    local_90 = local_88 + (long)local_90;
    pos = 0;
    iVar16 = 0;
LAB_00268a59:
    sVar1 = StringPiece::find(&local_50,',',pos);
    iVar15 = (int)sVar1;
    if ((int)sVar1 == -1) {
      iVar15 = (int)local_50.length_;
    }
    local_80 = StringPiece::substr(&local_50,pos,(long)(iVar15 - iVar16));
    lVar10 = local_80.length_;
    pcVar4 = local_80.ptr_;
    if (lVar10 != 0) {
      lVar13 = -1;
      lVar12 = 0;
      lVar3 = lVar10;
      do {
        lVar3 = lVar3 + -1;
        if ((4 < (byte)pcVar4[lVar12] - 9) && (pcVar4[lVar12] != 0x20)) {
          pcVar11 = pcVar4 + lVar10;
          goto LAB_00268af3;
        }
        local_80.length_ = lVar10 + lVar13;
        local_80.ptr_ = pcVar4 + lVar12 + 1;
        lVar12 = lVar12 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar10 != lVar12);
    }
    goto LAB_00268e98;
  }
LAB_0026901d:
  return n != (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0xffffffffffffffff;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Framework/proto file mapping line without colon sign: '") +
        string(line) + "'.";
    return false;
  }
  StringPiece framework_name = line.substr(0, offset);
  StringPiece proto_file_list = line.substr(offset + 1);
  TrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file = proto_file_list.substr(start, offset - start);
    TrimWhitespace(&proto_file);
    if (proto_file.size() != 0) {
      std::map<string, string>::iterator existing_entry =
          map_->find(string(proto_file));
      if (existing_entry != map_->end()) {
        std::cerr << "warning: duplicate proto file reference, replacing "
                     "framework entry for '"
                  << string(proto_file) << "' with '" << string(framework_name)
                  << "' (was '" << existing_entry->second << "')." << std::endl;
        std::cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        std::cerr << "note: framework mapping file had a proto file with a "
                     "space in, hopefully that isn't a missing comma: '"
                  << string(proto_file) << "'" << std::endl;
        std::cerr.flush();
      }

      (*map_)[string(proto_file)] = string(framework_name);
    }

    start = offset + 1;
  }

  return true;
}